

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

ScatterOut * __thiscall
cert::Dielectric::scatter
          (ScatterOut *__return_storage_ptr__,Dielectric *this,Vec3 point,Vec3 normal,UV uv,
          Ray *r_in,PRNG *random)

{
  float fVar1;
  float fVar2;
  Vec3 VVar3;
  undefined1 local_c8 [8];
  RefractDataOut refracted;
  float local_9c;
  float cosine;
  float reflect_prob;
  float ni_over_nt;
  float local_88;
  undefined1 local_80 [8];
  Vec3 reflected;
  Vec3 outward_normal;
  PRNG *random_local;
  Ray *r_in_local;
  Dielectric *this_local;
  UV uv_local;
  undefined1 local_38 [8];
  Vec3 normal_local;
  undefined1 local_18 [8];
  Vec3 point_local;
  
  normal_local.x = normal.z;
  local_38 = normal._0_8_;
  point_local.x = point.z;
  register0x00001200 = point._0_8_;
  local_18 = (undefined1  [8])register0x00001200;
  Vec3::Vec3((Vec3 *)&reflected.y);
  VVar3 = reflect(&r_in->direction,(Vec3 *)local_38);
  _reflect_prob = VVar3._0_8_;
  local_80._0_4_ = reflect_prob;
  local_80._4_4_ = ni_over_nt;
  local_88 = VVar3.z;
  reflected.x = local_88;
  local_9c = 0.0;
  fVar1 = dot(&r_in->direction,(Vec3 *)local_38);
  if (fVar1 <= 0.0) {
    reflected.y = (float)local_38._0_4_;
    reflected.z = (float)local_38._4_4_;
    cosine = 1.0 / *(float *)&(this->super_Material).field_0x14;
  }
  else {
    VVar3 = Vec3::operator-((Vec3 *)local_38);
    refracted.refracted._4_8_ = VVar3._0_8_;
    reflected.y = refracted.refracted.y;
    reflected.z = refracted.refracted.z;
    cosine = *(float *)&(this->super_Material).field_0x14;
    fVar1 = *(float *)&(this->super_Material).field_0x14;
    unique0x100002af = VVar3;
    fVar2 = dot(&r_in->direction,(Vec3 *)local_38);
    local_9c = Vec3::length(&r_in->direction);
    local_9c = (fVar1 * fVar2) / local_9c;
  }
  _local_c8 = refract_func(&r_in->direction,(Vec3 *)&reflected.y,cosine);
  if (((undefined1  [16])_local_c8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __return_storage_ptr__->is_scattered = true;
    Vec3::Vec3(&__return_storage_ptr__->attenuation,1.0,1.0,1.0);
    Ray::Ray(&__return_storage_ptr__->scattered,(Vec3 *)local_18,(Vec3 *)local_80);
    __return_storage_ptr__->index = 0.0;
    Ray::Ray(&__return_storage_ptr__->refracted,(Vec3 *)&VEC3_ZERO,(Vec3 *)VEC3_RIGHT);
  }
  else {
    fVar1 = schlick(local_9c,*(float *)&(this->super_Material).field_0x14);
    __return_storage_ptr__->is_scattered = true;
    Vec3::Vec3(&__return_storage_ptr__->attenuation,1.0,1.0,1.0);
    Ray::Ray(&__return_storage_ptr__->scattered,(Vec3 *)local_18,(Vec3 *)local_80);
    __return_storage_ptr__->index = fVar1;
    Ray::Ray(&__return_storage_ptr__->refracted,(Vec3 *)local_18,(Vec3 *)(local_c8 + 4));
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 outward_normal;
		Vec3 reflected = reflect (r_in.direction, normal);
		float ni_over_nt = 0;
		float reflect_prob = 0;
		float cosine = 0;

		if (dot (r_in.direction, normal) > 0)
		{
			outward_normal = -normal;
			ni_over_nt = ref_idx;
			cosine = ref_idx * dot (r_in.direction, normal) / r_in.direction.length ();
		}
		else
		{
			outward_normal = normal;
			ni_over_nt = 1.0 / ref_idx;
		}
		RefractDataOut refracted = refract_func (r_in.direction, outward_normal, ni_over_nt);
		if (refracted.is_refracted)
		{
			reflect_prob = schlick (cosine, ref_idx);
			return { true,
				Vec3 (1.0, 1.0, 1.0),
				Ray (point, reflected),
				reflect_prob,
				Ray (point, refracted.refracted) };
		}
		else
		{
			return { true, Vec3 (1.0, 1.0, 1.0), Ray (point, reflected), 0.0 };
		}
	}